

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merger.cc
# Opt level: O2

void __thiscall leveldb::anon_unknown_0::MergingIterator::Next(MergingIterator *this)

{
  IteratorWrapper *pIVar1;
  Comparator *pCVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar4;
  IteratorWrapper *this_00;
  int i;
  long lVar5;
  Slice local_50;
  Slice local_40;
  
  iVar3 = (*(this->super_Iterator)._vptr_Iterator[2])();
  if ((char)iVar3 != '\0') {
    if (this->direction_ != kForward) {
      lVar4 = 0;
      for (lVar5 = 0; lVar5 < this->n_; lVar5 = lVar5 + 1) {
        pIVar1 = this->children_;
        this_00 = (IteratorWrapper *)((long)&pIVar1->iter_ + lVar4);
        if (this_00 != this->current_) {
          iVar3 = (*(this->super_Iterator)._vptr_Iterator[8])(this);
          local_50.data_ = (char *)CONCAT44(extraout_var,iVar3);
          IteratorWrapper::Seek(this_00,&local_50);
          if ((&pIVar1->valid_)[lVar4] == true) {
            pCVar2 = this->comparator_;
            iVar3 = (*(this->super_Iterator)._vptr_Iterator[8])(this);
            local_50.data_ = (char *)CONCAT44(extraout_var_00,iVar3);
            local_40 = IteratorWrapper::key(this_00);
            iVar3 = (*pCVar2->_vptr_Comparator[2])(pCVar2,&local_50,&local_40);
            if (iVar3 == 0) {
              IteratorWrapper::Next(this_00);
            }
          }
        }
        lVar4 = lVar4 + 0x20;
      }
      this->direction_ = kForward;
    }
    IteratorWrapper::Next(this->current_);
    FindSmallest(this);
    return;
  }
  __assert_fail("Valid()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/table/merger.cc"
                ,0x38,"virtual void leveldb::(anonymous namespace)::MergingIterator::Next()");
}

Assistant:

void Next() override {
    assert(Valid());

    // Ensure that all children are positioned after key().
    // If we are moving in the forward direction, it is already
    // true for all of the non-current_ children since current_ is
    // the smallest child and key() == current_->key().  Otherwise,
    // we explicitly position the non-current_ children.
    if (direction_ != kForward) {
      for (int i = 0; i < n_; i++) {
        IteratorWrapper* child = &children_[i];
        if (child != current_) {
          child->Seek(key());
          if (child->Valid() &&
              comparator_->Compare(key(), child->key()) == 0) {
            child->Next();
          }
        }
      }
      direction_ = kForward;
    }

    current_->Next();
    FindSmallest();
  }